

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

char * __thiscall
llvm::detail::IEEEFloat::convertNormalToHexString
          (IEEEFloat *this,char *dst,uint hexDigits,bool upperCase,roundingMode rounding_mode)

{
  ulong uVar1;
  short sVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  lostFraction lost_fraction;
  long lVar7;
  byte *pbVar8;
  undefined7 in_register_00000009;
  int iVar9;
  ulong uVar10;
  uint n;
  char *__s;
  uint uVar11;
  uint result;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  Significand *parts;
  char buff [40];
  undefined8 local_60;
  byte local_58 [40];
  
  *dst = '0';
  uVar12 = CONCAT71(in_register_00000009,upperCase) & 0xffffffff;
  cVar4 = ((byte)uVar12 ^ 1) * ' ';
  local_60 = CONCAT71((int7)(uVar12 >> 8),cVar4);
  dst[1] = cVar4 + 'X';
  pcVar14 = "0123456789abcdef0";
  if ((int)CONCAT71(in_register_00000009,upperCase) != 0) {
    pcVar14 = "0123456789ABCDEF0";
  }
  uVar11 = this->semantics->precision;
  if (uVar11 - 0x40 < 0xffffff80) {
    parts = (Significand *)(this->significand).parts;
  }
  else {
    parts = &this->significand;
  }
  n = uVar11 + 0x40 >> 6;
  uVar6 = APInt::tcLSB(&parts->part,n);
  uVar6 = (uVar11 - uVar6) + 6 >> 2;
  if (hexDigits == 0) {
    bVar5 = false;
  }
  else if (hexDigits < uVar6) {
    uVar6 = uVar11 + 3 + hexDigits * -4;
    lost_fraction = lostFractionThroughTruncation(&parts->part,n,uVar6);
    bVar5 = roundAwayFromZero(this,rounding_mode,lost_fraction,uVar6);
    uVar6 = hexDigits;
  }
  else {
    bVar5 = false;
    uVar6 = hexDigits;
  }
  lVar13 = 3;
  __s = dst + 3;
  if (0x3f < uVar11 + 0x42 && uVar6 != 0) {
    bVar3 = (byte)(uVar11 + 3) & 0x3f;
    uVar12 = (ulong)(uVar11 + 0x42 >> 6);
    do {
      uVar1 = uVar12 - 1;
      if (n == (uint)uVar1) {
        uVar10 = 0;
      }
      else {
        uVar10 = parts[uVar1].part << (0x40 - bVar3 & 0x3f);
      }
      if (uVar1 != 0) {
        uVar10 = uVar10 | parts[uVar12 - 2].part >> bVar3;
      }
      uVar12 = 0x10;
      if (uVar6 < 0x10) {
        uVar12 = (ulong)uVar6;
      }
      uVar10 = uVar10 >> ((char)uVar12 * -4 & 0x3fU);
      uVar15 = uVar12;
      do {
        uVar11 = (uint)uVar10;
        uVar10 = uVar10 >> 4;
        dst[uVar15 + lVar13 + -1] = pcVar14[uVar11 & 0xf];
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
      lVar13 = lVar13 + uVar12;
      uVar6 = uVar6 - (int)uVar12;
    } while ((uVar6 != 0) && (uVar12 = uVar1, uVar1 != 0));
    __s = dst + lVar13;
  }
  if (bVar5 == false) {
    memset(__s,0x30,(ulong)uVar6);
    lVar13 = lVar13 + (ulong)uVar6;
  }
  else {
    lVar7 = lVar13 + 1;
    do {
      cVar4 = dst[lVar7 + -2];
      iVar9 = (int)cVar4;
      if ((byte)(cVar4 - 0x30U) < 10) {
        iVar9 = iVar9 + -0x30;
      }
      else if ((byte)(cVar4 + 0x9fU) < 6) {
        iVar9 = iVar9 + -0x57;
      }
      else {
        iVar9 = iVar9 + -0x37;
        if (5 < (byte)(cVar4 + 0xbfU)) {
          iVar9 = -1;
        }
      }
      cVar4 = pcVar14[iVar9 + 1];
      dst[lVar7 + -2] = cVar4;
      lVar7 = lVar7 + -1;
    } while (cVar4 == '0');
    if (lVar7 < 4) {
      __assert_fail("q >= p",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xac1,
                    "char *llvm::detail::IEEEFloat::convertNormalToHexString(char *, unsigned int, bool, roundingMode) const"
                   );
    }
  }
  dst[2] = dst[3];
  lVar7 = 3;
  if (lVar13 != 4) {
    dst[3] = '.';
    lVar7 = lVar13;
  }
  pbVar8 = (byte *)(dst + lVar7 + 1);
  dst[lVar7] = (byte)local_60 | 0x50;
  sVar2 = this->exponent;
  if (sVar2 < 0) {
    *pbVar8 = 0x2d;
    lVar13 = 0;
    uVar11 = -(int)sVar2;
    do {
      local_58[lVar13] = (char)uVar11 + (char)(uVar11 / 10) * -10 | 0x30;
      lVar13 = lVar13 + 1;
      bVar5 = 9 < uVar11;
      uVar11 = uVar11 / 10;
    } while (bVar5);
    pbVar8 = (byte *)(dst + lVar7 + 2);
    do {
      *pbVar8 = local_58[lVar13 + -1];
      pbVar8 = pbVar8 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  else {
    lVar13 = 0;
    uVar11 = (int)sVar2;
    do {
      local_58[lVar13] = (char)uVar11 + (char)(uVar11 / 10) * -10 | 0x30;
      lVar13 = lVar13 + 1;
      bVar5 = 9 < uVar11;
      uVar11 = uVar11 / 10;
    } while (bVar5);
    do {
      *pbVar8 = local_58[lVar13 + -1];
      pbVar8 = pbVar8 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  return (char *)pbVar8;
}

Assistant:

char *IEEEFloat::convertNormalToHexString(char *dst, unsigned int hexDigits,
                                          bool upperCase,
                                          roundingMode rounding_mode) const {
  unsigned int count, valueBits, shift, partsCount, outputDigits;
  const char *hexDigitChars;
  const integerPart *significand;
  char *p;
  bool roundUp;

  *dst++ = '0';
  *dst++ = upperCase ? 'X': 'x';

  roundUp = false;
  hexDigitChars = upperCase ? hexDigitsUpper: hexDigitsLower;

  significand = significandParts();
  partsCount = partCount();

  /* +3 because the first digit only uses the single integer bit, so
     we have 3 virtual zero most-significant-bits.  */
  valueBits = semantics->precision + 3;
  shift = integerPartWidth - valueBits % integerPartWidth;

  /* The natural number of digits required ignoring trailing
     insignificant zeroes.  */
  outputDigits = (valueBits - significandLSB () + 3) / 4;

  /* hexDigits of zero means use the required number for the
     precision.  Otherwise, see if we are truncating.  If we are,
     find out if we need to round away from zero.  */
  if (hexDigits) {
    if (hexDigits < outputDigits) {
      /* We are dropping non-zero bits, so need to check how to round.
         "bits" is the number of dropped bits.  */
      unsigned int bits;
      lostFraction fraction;

      bits = valueBits - hexDigits * 4;
      fraction = lostFractionThroughTruncation (significand, partsCount, bits);
      roundUp = roundAwayFromZero(rounding_mode, fraction, bits);
    }
    outputDigits = hexDigits;
  }

  /* Write the digits consecutively, and start writing in the location
     of the hexadecimal point.  We move the most significant digit
     left and add the hexadecimal point later.  */
  p = ++dst;

  count = (valueBits + integerPartWidth - 1) / integerPartWidth;

  while (outputDigits && count) {
    integerPart part;

    /* Put the most significant integerPartWidth bits in "part".  */
    if (--count == partsCount)
      part = 0;  /* An imaginary higher zero part.  */
    else
      part = significand[count] << shift;

    if (count && shift)
      part |= significand[count - 1] >> (integerPartWidth - shift);

    /* Convert as much of "part" to hexdigits as we can.  */
    unsigned int curDigits = integerPartWidth / 4;

    if (curDigits > outputDigits)
      curDigits = outputDigits;
    dst += partAsHex (dst, part, curDigits, hexDigitChars);
    outputDigits -= curDigits;
  }

  if (roundUp) {
    char *q = dst;

    /* Note that hexDigitChars has a trailing '0'.  */
    do {
      q--;
      *q = hexDigitChars[hexDigitValue (*q) + 1];
    } while (*q == '0');
    assert(q >= p);
  } else {
    /* Add trailing zeroes.  */
    memset (dst, '0', outputDigits);
    dst += outputDigits;
  }

  /* Move the most significant digit to before the point, and if there
     is something after the decimal point add it.  This must come
     after rounding above.  */
  p[-1] = p[0];
  if (dst -1 == p)
    dst--;
  else
    p[0] = '.';

  /* Finally output the exponent.  */
  *dst++ = upperCase ? 'P': 'p';

  return writeSignedDecimal (dst, exponent);
}